

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

void __thiscall ghc::filesystem::filesystem_error::~filesystem_error(filesystem_error *this)

{
  *(undefined ***)this = &PTR__filesystem_error_0010cca0;
  std::__cxx11::string::~string((string *)&this->_p2);
  std::__cxx11::string::~string((string *)&this->_p1);
  std::__cxx11::string::~string((string *)&this->_what_arg);
  std::system_error::~system_error(&this->super_system_error);
  return;
}

Assistant:

class GHC_FS_API_CLASS filesystem_error : public std::system_error
{
public:
    filesystem_error(const std::string& what_arg, std::error_code ec);
    filesystem_error(const std::string& what_arg, const path& p1, std::error_code ec);
    filesystem_error(const std::string& what_arg, const path& p1, const path& p2, std::error_code ec);
    const path& path1() const noexcept;
    const path& path2() const noexcept;
    const char* what() const noexcept override;

private:
    std::string _what_arg;
    std::error_code _ec;
    path _p1, _p2;
}